

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenerator.cpp
# Opt level: O0

CodeGenerator * __thiscall CodeGenerator::generate_cpp_code_abi_cxx11_(CodeGenerator *this)

{
  string local_40 [39];
  undefined1 local_19;
  CodeGenerator *this_local;
  string *code;
  
  local_19 = 0;
  this_local = this;
  std::operator+((char *)local_40,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "// Generated by program homework solver\n\n#include <iostream>\n\nusing namespace std;\n\nint64_t f(int x) {\n\tint64_t answer ="
                );
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                 (char *)local_40);
  std::__cxx11::string::~string(local_40);
  return this;
}

Assistant:

string CodeGenerator::generate_cpp_code() {
    string code =
            "// Generated by program homework solver"
            "\n\n"
            "#include <iostream>\n\n"
            "using namespace std;\n\n"
            "int64_t f(int x) {\n"
            "\tint64_t answer =" + CodeGenerator::func + ";\n"
            "\treturn answer;\n"
            "}\n\n"
            "int main(){\n"
            "\tfor(int i=0; i<20; i++){\n"
            "\t\tcout << f(i) << endl;\n"
            "\t}\n"
            "\treturn 0;\n"
            "}";

    return code;
}